

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  XML_Convert_Result XVar4;
  char **ppcVar5;
  long lVar6;
  unsigned_short **ppuVar7;
  char *pcVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  int iVar9;
  int iVar10;
  unsigned_short *in_R8;
  char **ppcVar11;
  
  ppcVar5 = (char **)(end + -(long)ptr);
  if ((long)ppcVar5 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  pcVar8 = (char *)(ulong)bVar1;
  iVar9 = 0;
  ppcVar11 = (char **)ptr;
  iVar10 = iVar9;
  if (bVar1 < 0x13) {
    if (bVar1 == 5) {
      if (ppcVar5 == (char **)0x1) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar8,ppcVar5);
      if (iVar3 == 0) {
        XVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcVar5);
        goto LAB_0017b6ac;
      }
    }
    else if (bVar1 == 6) {
      if ((long)ppcVar5 < 3) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[1])(enc,ptr,pcVar8,ppcVar5);
      if (iVar3 == 0) {
        XVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar5);
        goto LAB_0017b681;
      }
    }
    else {
      iVar10 = 0;
      if (bVar1 == 7) {
        if ((long)ppcVar5 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar8,(char *)ppcVar5);
        iVar10 = iVar9;
        if (iVar3 == 0) {
          XVar4 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX,ppcVar5);
          while( true ) {
            lVar6 = 4;
            while( true ) {
              while( true ) {
                ppcVar11 = (char **)ptr;
                iVar10 = iVar9;
                if (XVar4 == XML_CONVERT_COMPLETED) goto LAB_0017b6b9;
LAB_0017b5d1:
                while( true ) {
                  ptr = (char *)((long)ptr + lVar6);
                  lVar6 = (long)end - (long)ptr;
                  if (lVar6 < 1) {
                    return -1;
                  }
                  ppuVar7 = (unsigned_short **)(ulong)(byte)*ptr;
                  bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar7);
                  pcVar8 = (char *)(ulong)bVar1;
                  ppcVar11 = (char **)ptr;
                  if (bVar1 < 0x12) break;
                  lVar6 = 1;
                  if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                    iVar10 = iVar9;
                    if (bVar1 == 0x12) {
                      ppcVar11 = (char **)((long)ptr + 1);
                      iVar10 = 9;
                    }
                    goto LAB_0017b6b9;
                  }
                }
                if (bVar1 != 5) break;
                if (lVar6 == 1) {
                  return -2;
                }
                iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar8,(char **)ppuVar7);
                iVar10 = iVar9;
                if (iVar3 != 0) goto LAB_0017b6b9;
                XVar4 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_03,ppuVar7,in_R8);
LAB_0017b6ac:
                lVar6 = 2;
              }
              if (bVar1 != 6) break;
              if (lVar6 < 3) {
                return -2;
              }
              iVar3 = (*enc[3].literalScanners[1])(enc,ptr,pcVar8,(char **)ppuVar7);
              iVar10 = iVar9;
              if (iVar3 != 0) goto LAB_0017b6b9;
              XVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_0017b681:
              lVar6 = 3;
            }
            iVar10 = iVar9;
            if (bVar1 != 7) break;
            if (lVar6 < 4) {
              return -2;
            }
            iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar8,(char *)ppuVar7);
            if (iVar3 != 0) break;
            XVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_02,(char **)ppuVar7);
          }
        }
      }
    }
  }
  else if (bVar1 == 0x13) {
    ppcVar11 = (char **)(ptr + 1);
    if ((char **)end == ppcVar11 || (long)end - (long)ppcVar11 < 0) {
      return -1;
    }
    if ((ulong)*(byte *)ppcVar11 == 0x78) {
      ppcVar11 = (char **)(ptr + 2);
      if ((char **)end == ppcVar11 || (long)end - (long)ppcVar11 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11) & 0xfe) != 0x18)
      goto LAB_0017b6b9;
      ppcVar11 = (char **)(ptr + 3);
      lVar6 = (long)end - (long)ppcVar11;
      while( true ) {
        if (lVar6 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11);
        if (1 < bVar1 - 0x18) break;
        ppcVar11 = (char **)((long)ppcVar11 + 1);
        lVar6 = lVar6 + -1;
      }
      if (bVar1 != 0x12) goto LAB_0017b6b9;
      ppcVar5 = (char **)((long)ppcVar11 + 1);
    }
    else {
      if (*(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11) != '\x19') goto LAB_0017b6b9;
      lVar6 = (long)ppcVar5 + -2;
      ppcVar5 = (char **)(ptr + 2);
      do {
        ppcVar11 = ppcVar5;
        if (lVar6 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11);
        ppcVar5 = (char **)((long)ppcVar11 + 1);
        lVar6 = lVar6 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 != '\x12') goto LAB_0017b6b9;
    }
    ppcVar11 = ppcVar5;
    iVar10 = 10;
  }
  else {
    lVar6 = 1;
    if (bVar1 == 0x16) goto LAB_0017b5d1;
    if (bVar1 == 0x18) goto LAB_0017b5d1;
  }
LAB_0017b6b9:
  *nextTokPtr = (char *)ppcVar11;
  return iVar10;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}